

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::GetTypedArrayInfoAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ArrayBufferBase *result;
  Var aValue;
  TypedArrayBase *pTVar1;
  AutoNestedHandledExceptionType local_24 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (evt->EventKind == GetTypedArrayInfoActionTag) {
    aValue = InflateVarInReplay(executeContext,(TTDVar)evt[1].EventTimeStamp);
    pTVar1 = Js::VarTo<Js::TypedArrayBase>(aValue);
    result = (pTVar1->super_ArrayBufferParent).arrayBuffer.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_24,ExceptionType_OutOfMemory);
    JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)61>
              (executeContext,evt,result);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_24);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void GetTypedArrayInfoAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::GetTypedArrayInfoActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));

            Js::TypedArrayBase* typedArrayBase = Js::VarTo<Js::TypedArrayBase>(var);
            Js::Var res = typedArrayBase->GetArrayBuffer();

            //Need additional notify since JsRTActionHandleResultForReplay may allocate but GetTypedArrayInfo does not enter runtime
            //Failure will kick all the way out to replay loop -- which is what we want
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_OutOfMemory);
            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::GetTypedArrayInfoActionTag>(executeContext, evt, res);
        }